

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wol.cc
# Opt level: O3

void __thiscall rcdiscover::WOL::WOL(WOL *this,uint64_t hardware_addr,uint16_t port)

{
  long lVar1;
  uchar *puVar2;
  undefined1 auVar3 [16];
  array<unsigned_char,_6UL> result;
  long lVar4;
  
  lVar1 = 0x20;
  puVar2 = result._M_elems + 1;
  auVar3 = _DAT_00119760;
  do {
    if (SUB164(auVar3 ^ _DAT_00119770,4) == -0x80000000 &&
        SUB164(auVar3 ^ _DAT_00119770,0) < -0x7ffffffa) {
      ((array<unsigned_char,_6UL> *)(puVar2 + -1))->_M_elems[0] =
           (uchar)(hardware_addr >> ((byte)lVar1 + 8 & 0x3f));
      *puVar2 = (uchar)(hardware_addr >> ((byte)lVar1 & 0x3f));
    }
    lVar4 = auVar3._8_8_;
    auVar3._0_8_ = auVar3._0_8_ + 2;
    auVar3._8_8_ = lVar4 + 2;
    lVar1 = lVar1 + -0x10;
    puVar2 = puVar2 + 2;
  } while (lVar1 != -0x10);
  *(short *)((this->hardware_addr_)._M_elems + 4) = (short)stack0xfffffffffffffffc;
  *(undefined4 *)(this->hardware_addr_)._M_elems = result._M_elems._0_4_;
  this->port_ = port;
  return;
}

Assistant:

WOL::WOL(uint64_t hardware_addr, uint16_t port) noexcept :
  hardware_addr_(toByteArray<6>(std::move(hardware_addr))),
  port_{port}
{ }